

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mad.cpp
# Opt level: O0

bool __thiscall duckdb::FrameSet::Contains(FrameSet *this,idx_t i)

{
  size_type sVar1;
  const_reference pvVar2;
  ulong in_RSI;
  vector<duckdb::FrameBounds,_true> *in_RDI;
  value_type *frame;
  idx_t f;
  ulong __n;
  ulong local_20;
  
  local_20 = 0;
  while( true ) {
    __n = local_20;
    sVar1 = std::vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>::size
                      ((vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_> *)
                       (in_RDI->
                       super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>).
                       super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>
                       ._M_impl.super__Vector_impl_data._M_start);
    if (sVar1 <= __n) {
      return false;
    }
    pvVar2 = vector<duckdb::FrameBounds,_true>::operator[](in_RDI,__n);
    if ((pvVar2->start <= in_RSI) && (in_RSI < pvVar2->end)) break;
    local_20 = local_20 + 1;
  }
  return true;
}

Assistant:

inline bool Contains(idx_t i) const {
		for (idx_t f = 0; f < frames.size(); ++f) {
			const auto &frame = frames[f];
			if (frame.start <= i && i < frame.end) {
				return true;
			}
		}
		return false;
	}